

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

void __thiscall
Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::initialize_filtration
          (Simplex_tree<Simplex_tree_options_stable_simplex_handles> *this,
          bool ignore_infinite_values)

{
  undefined7 in_register_00000031;
  anon_class_1_0_00000001 local_9;
  is_before_in_totally_ordered_filtration local_8;
  
  local_8.st_ = this;
  if ((int)CONCAT71(in_register_00000031,ignore_infinite_values) == 0) {
    initialize_filtration<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::is_before_in_totally_ordered_filtration,Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::initialize_filtration(bool)const::_lambda(boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<int_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,true>)_2_>
              (this,&local_8,&local_9);
  }
  else {
    initialize_filtration<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::is_before_in_totally_ordered_filtration,Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::initialize_filtration(bool)const::_lambda(boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<int_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,true>)_1_>
              (this,&local_8,&local_9);
  }
  return;
}

Assistant:

void initialize_filtration(bool ignore_infinite_values = false) const {
    if (ignore_infinite_values){
      initialize_filtration(is_before_in_totally_ordered_filtration(this), [&](Simplex_handle sh) -> bool {
        return filtration(sh) == Filtration_simplex_base_real::get_infinity();
      });
    } else {
      initialize_filtration(is_before_in_totally_ordered_filtration(this), [](Simplex_handle) -> bool {
        return false;
      });
    }
  }